

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O1

void despot::AEMS::Expand
               (QNode *qnode,BeliefLowerBound *lb,BeliefUpperBound *ub,BeliefMDP *model,
               History *history)

{
  QNode *this;
  uint uVar1;
  int iVar2;
  int iVar3;
  VNode *pVVar4;
  Belief *pBVar5;
  log_ostream *plVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  mapped_type *ppVVar8;
  _Base_ptr p_Var9;
  _Self __tmp;
  double extraout_XMM0_Qa;
  double value;
  double value_00;
  double dVar10;
  OBS_TYPE obs;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  obss;
  double local_d0;
  double local_c8;
  OBS_TYPE local_c0;
  double local_b8;
  _Base_ptr local_b0;
  uint local_a4;
  QNode *local_a0;
  BeliefUpperBound *local_98;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *local_90;
  VNode *local_88;
  Belief *local_80;
  double local_78;
  double local_70;
  double local_68;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  local_60;
  
  local_98 = ub;
  pVVar4 = QNode::parent(qnode);
  local_a4 = QNode::edge(qnode);
  local_90 = QNode::children(qnode);
  local_88 = pVVar4;
  pBVar5 = VNode::belief(pVVar4);
  uVar1 = QNode::edge(qnode);
  (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1e])(model,pBVar5,(ulong)uVar1);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8 = extraout_XMM0_Qa;
  local_a0 = qnode;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar1 = QNode::edge(qnode);
  (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1d])(model,pBVar5,(ulong)uVar1,&local_60);
  local_c8 = local_b8;
  local_d0 = local_b8;
  local_80 = pBVar5;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_c0 = *(OBS_TYPE *)(p_Var9 + 1);
      local_b0 = p_Var9[1]._M_parent;
      iVar2 = logging::level();
      if (0 < iVar2) {
        iVar2 = logging::level();
        if (3 < iVar2) {
          plVar6 = logging::stream(4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&plVar6->super_ostream,"[AEMS::Expand] Creating node for obs ",0x25);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," with weight ",0xd);
          poVar7 = std::ostream::_M_insert<double>((double)local_b0);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
      }
      pVVar4 = (VNode *)operator_new(0x98);
      iVar2 = (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1c])(model,local_80,(ulong)local_a4,local_c0)
      ;
      iVar3 = VNode::depth(local_88);
      VNode::VNode(pVVar4,(Belief *)CONCAT44(extraout_var,iVar2),iVar3 + 1,local_a0,local_c0);
      pVVar4->likelihood = (double)local_b0;
      iVar2 = logging::level();
      if (0 < iVar2) {
        iVar2 = logging::level();
        if (3 < iVar2) {
          plVar6 = logging::stream(4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&plVar6->super_ostream," New node created!",0x12);
          std::ios::widen((char)(plVar6->super_ostream)._vptr_basic_ostream[-3] + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
        }
      }
      ppVVar8 = std::
                map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                ::operator[](local_90,&local_c0);
      *ppVVar8 = pVVar4;
      pBVar5 = VNode::belief(pVVar4);
      (*lb->_vptr_BeliefLowerBound[3])(lb,pBVar5);
      VNode::lower_bound(pVVar4,value);
      pBVar5 = VNode::belief(pVVar4);
      (*local_98->_vptr_BeliefUpperBound[2])(local_98,pBVar5);
      VNode::upper_bound(pVVar4,value_00);
      local_68 = DAT_00193de8;
      local_70 = VNode::lower_bound(pVVar4);
      local_78 = DAT_00193de8;
      dVar10 = VNode::upper_bound(pVVar4);
      local_d0 = local_d0 + local_68 * (double)local_b0 * local_70;
      local_c8 = local_c8 + local_78 * (double)local_b0 * dVar10;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != &local_60._M_impl.super__Rb_tree_header);
  }
  this = local_a0;
  local_a0->step_reward = local_b8;
  QNode::lower_bound(local_a0,local_d0);
  QNode::upper_bound(this,local_c8);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void AEMS::Expand(QNode* qnode, BeliefLowerBound* lb, BeliefUpperBound* ub,
	const BeliefMDP* model, History& history) {
	VNode* parent = qnode->parent();
	ACT_TYPE action = qnode->edge();
	map<OBS_TYPE, VNode*>& children = qnode->children();

	const Belief* belief = parent->belief();
	// cout << *belief << endl;

	double step_reward = model->StepReward(belief, qnode->edge());

	map<OBS_TYPE, double> obss;
	model->Observe(belief, qnode->edge(), obss);

	double lower_bound = step_reward;
	double upper_bound = step_reward;

	// Create new belief nodes
	for (map<OBS_TYPE, double>::iterator it = obss.begin(); it != obss.end(); it++) {
		OBS_TYPE obs = it->first;
		double weight = it->second;
		logd << "[AEMS::Expand] Creating node for obs " << obs
			<< " with weight " << weight << endl;
		VNode* vnode = new VNode(model->Tau(belief, action, obs),
			parent->depth() + 1, qnode, obs);
		vnode->likelihood = weight;
		logd << " New node created!" << endl;
		children[obs] = vnode;

		InitLowerBound(vnode, lb, history);
		InitUpperBound(vnode, ub, history);

		lower_bound += weight * Globals::Discount() * vnode->lower_bound();
		upper_bound += weight * Globals::Discount() * vnode->upper_bound();
	}

	qnode->step_reward = step_reward;
	qnode->lower_bound(lower_bound);
	qnode->upper_bound(upper_bound);
}